

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O1

void share_try_cleanup(ssh_sharing_connstate *cs)

{
  BinarySink *pBVar1;
  ConnectionLayer *pCVar2;
  ssh_sharing_state *psVar3;
  uint *e;
  strbuf *psVar4;
  share_channel *chan;
  undefined8 *e_00;
  int iVar5;
  
  e = (uint *)index234(cs->halfchannels,0);
  while (e != (uint *)0x0) {
    psVar4 = strbuf_new();
    pBVar1 = psVar4->binarysink_;
    BinarySink_put_uint32(pBVar1,(ulong)*e);
    BinarySink_put_uint32(pBVar1,2);
    BinarySink_put_stringz(pBVar1,"PuTTY downstream no longer available");
    BinarySink_put_stringz(pBVar1,"en");
    pCVar2 = cs->parent->cl;
    (*pCVar2->vt->send_packet_from_downstream)
              (pCVar2,cs->id,0x5c,psVar4->s,(int)psVar4->len,"cleanup after downstream went away");
    strbuf_free(psVar4);
    del234(cs->halfchannels,e);
    safefree(e);
    e = (uint *)index234(cs->halfchannels,0);
  }
  iVar5 = 0;
  chan = (share_channel *)index234(cs->channels_by_us,0);
  while (chan != (share_channel *)0x0) {
    if ((chan->state | 2U) != 3) {
      psVar4 = strbuf_new();
      BinarySink_put_uint32(psVar4->binarysink_,(ulong)chan->server_id);
      pCVar2 = cs->parent->cl;
      (*pCVar2->vt->send_packet_from_downstream)
                (pCVar2,cs->id,0x61,psVar4->s,(int)psVar4->len,"cleanup after downstream went away")
      ;
      strbuf_free(psVar4);
      if (chan->state == 2) {
        pCVar2 = cs->parent->cl;
        (*pCVar2->vt->delete_sharing_channel)(pCVar2,chan->upstream_id);
        share_remove_channel(cs,chan);
        iVar5 = iVar5 + -1;
      }
      else {
        chan->state = 1;
      }
    }
    iVar5 = iVar5 + 1;
    chan = (share_channel *)index234(cs->channels_by_us,iVar5);
  }
  iVar5 = 0;
  e_00 = (undefined8 *)index234(cs->forwardings,0);
  while (e_00 != (undefined8 *)0x0) {
    if (*(char *)((long)e_00 + 0xc) == '\x01') {
      psVar4 = strbuf_new();
      pBVar1 = psVar4->binarysink_;
      BinarySink_put_stringz(pBVar1,"cancel-tcpip-forward");
      BinarySink_put_bool(pBVar1,false);
      BinarySink_put_stringz(pBVar1,(char *)*e_00);
      BinarySink_put_uint32(pBVar1,(long)*(int *)(e_00 + 1));
      pCVar2 = cs->parent->cl;
      (*pCVar2->vt->send_packet_from_downstream)
                (pCVar2,cs->id,0x50,psVar4->s,(int)psVar4->len,"cleanup after downstream went away")
      ;
      strbuf_free(psVar4);
      pCVar2 = cs->parent->cl;
      (*pCVar2->vt->rportfwd_remove)(pCVar2,(ssh_rportfwd *)e_00[2]);
      del234(cs->forwardings,e_00);
      safefree(e_00);
      iVar5 = iVar5 + -1;
    }
    iVar5 = iVar5 + 1;
    e_00 = (undefined8 *)index234(cs->forwardings,iVar5);
  }
  iVar5 = count234(cs->halfchannels);
  if (((iVar5 == 0) && (iVar5 = count234(cs->channels_by_us), iVar5 == 0)) &&
     (iVar5 = count234(cs->forwardings), iVar5 == 0)) {
    psVar3 = cs->parent;
    del234(psVar3->connections,cs);
    log_downstream(cs,"disconnected");
    share_connstate_free(cs);
    iVar5 = count234(psVar3->connections);
    if ((iVar5 == 0) && (pCVar2 = psVar3->cl, pCVar2 != (ConnectionLayer *)0x0)) {
      (*pCVar2->vt->sharing_no_more_downstreams)(pCVar2);
      return;
    }
  }
  return;
}

Assistant:

static void share_try_cleanup(struct ssh_sharing_connstate *cs)
{
    int i;
    struct share_halfchannel *hc;
    struct share_channel *chan;
    struct share_forwarding *fwd;

    /*
     * Any half-open channels, i.e. those for which we'd received
     * CHANNEL_OPEN from the server but not passed back a response
     * from downstream, should be responded to with OPEN_FAILURE.
     */
    while ((hc = (struct share_halfchannel *)
            index234(cs->halfchannels, 0)) != NULL) {
        static const char reason[] = "PuTTY downstream no longer available";
        static const char lang[] = "en";
        strbuf *packet;

        packet = strbuf_new();
        put_uint32(packet, hc->server_id);
        put_uint32(packet, SSH2_OPEN_CONNECT_FAILED);
        put_stringz(packet, reason);
        put_stringz(packet, lang);
        ssh_send_packet_from_downstream(
            cs->parent->cl, cs->id, SSH2_MSG_CHANNEL_OPEN_FAILURE,
            packet->s, packet->len,
            "cleanup after downstream went away");
        strbuf_free(packet);

        share_remove_halfchannel(cs, hc);
    }

    /*
     * Any actually open channels should have a CHANNEL_CLOSE sent for
     * them, unless we've already done so. We won't be able to
     * actually clean them up until CHANNEL_CLOSE comes back from the
     * server, though (unless the server happens to have sent a CLOSE
     * already).
     *
     * Another annoying exception is UNACKNOWLEDGED channels, i.e.
     * we've _sent_ a CHANNEL_OPEN to the server but not received an
     * OPEN_CONFIRMATION or OPEN_FAILURE. We must wait for a reply
     * before closing the channel, because until we see that reply we
     * won't have the server's channel id to put in the close message.
     */
    for (i = 0; (chan = (struct share_channel *)
                 index234(cs->channels_by_us, i)) != NULL; i++) {
        strbuf *packet;

        if (chan->state != SENT_CLOSE && chan->state != UNACKNOWLEDGED) {
            packet = strbuf_new();
            put_uint32(packet, chan->server_id);
            ssh_send_packet_from_downstream(
                cs->parent->cl, cs->id, SSH2_MSG_CHANNEL_CLOSE,
                packet->s, packet->len,
                "cleanup after downstream went away");
            strbuf_free(packet);

            if (chan->state != RCVD_CLOSE) {
                chan->state = SENT_CLOSE;
            } else {
                /* In this case, we _can_ clear up the channel now. */
                ssh_delete_sharing_channel(cs->parent->cl, chan->upstream_id);
                share_remove_channel(cs, chan);
                i--;    /* don't accidentally skip one as a result */
            }
        }
    }

    /*
     * Any remote port forwardings we're managing on behalf of this
     * downstream should be cancelled. Again, we must defer those for
     * which we haven't yet seen REQUEST_SUCCESS/FAILURE.
     *
     * We take a fire-and-forget approach during cleanup, not
     * bothering to set want_reply.
     */
    for (i = 0; (fwd = (struct share_forwarding *)
                 index234(cs->forwardings, i)) != NULL; i++) {
        if (fwd->active) {
            strbuf *packet = strbuf_new();
            put_stringz(packet, "cancel-tcpip-forward");
            put_bool(packet, false);       /* !want_reply */
            put_stringz(packet, fwd->host);
            put_uint32(packet, fwd->port);
            ssh_send_packet_from_downstream(
                cs->parent->cl, cs->id, SSH2_MSG_GLOBAL_REQUEST,
                packet->s, packet->len,
                "cleanup after downstream went away");
            strbuf_free(packet);

            ssh_rportfwd_remove(cs->parent->cl, fwd->rpf);
            share_remove_forwarding(cs, fwd);
            i--;    /* don't accidentally skip one as a result */
        }
    }

    if (count234(cs->halfchannels) == 0 &&
        count234(cs->channels_by_us) == 0 &&
        count234(cs->forwardings) == 0) {
        struct ssh_sharing_state *sharestate = cs->parent;

        /*
         * Now we're _really_ done, so we can get rid of cs completely.
         */
        del234(sharestate->connections, cs);
        log_downstream(cs, "disconnected");
        share_connstate_free(cs);

        /*
         * And if this was the last downstream, notify the connection
         * layer, because it might now be time to wind up the whole
         * SSH connection.
         */
        if (count234(sharestate->connections) == 0 && sharestate->cl)
            ssh_sharing_no_more_downstreams(sharestate->cl);
    }
}